

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_server.cpp
# Opt level: O0

void __thiscall
cab_server::cab_server
          (cab_server *this,application *application,io_service *io_service,uint16_t port)

{
  ostream *poVar1;
  tcp local_44;
  basic_endpoint<boost::asio::ip::tcp> local_40;
  unsigned_short local_22;
  io_service *piStack_20;
  uint16_t port_local;
  io_service *io_service_local;
  application *application_local;
  cab_server *this_local;
  
  this->_application = application;
  this->_io_service = io_service;
  local_22 = port;
  piStack_20 = io_service;
  io_service_local = (io_service *)application;
  application_local = (application *)this;
  local_44 = boost::asio::ip::tcp::v4();
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            (&local_40,&local_44,local_22);
  boost::asio::
  basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket_acceptor<boost::asio::io_context>
            (&this->_acceptor,io_service,&local_40,true,(type *)0x0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Cab server Listening on *:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_22);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

cab_server::cab_server(application& application, boost::asio::io_service& io_service, std::uint16_t port):
    _application(application),
    _io_service(io_service),
    _acceptor(io_service, boost::asio::ip::tcp::endpoint(boost::asio::ip::tcp::v4(), port))
{
    std::cout << "Cab server Listening on *:" << port << "\n";
}